

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_avx2::c_imm_v64_shl_n_16<2>(c_v64 a)

{
  undefined1 auVar1 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64;
  auVar1 = vpsllw_avx(auVar1,2);
  return (c_v64)auVar1._0_8_;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = (uint16_t)(a.u16[c] << n);
  return t;
}